

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

shared_ptr<kratos::LatchStmtBlock> __thiscall kratos::Generator::latch(Generator *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Generator *in_RSI;
  shared_ptr<kratos::LatchStmtBlock> sVar1;
  shared_ptr<kratos::Stmt> local_30;
  undefined1 local_19;
  Generator *this_local;
  shared_ptr<kratos::LatchStmtBlock> *stmt;
  
  local_19 = 0;
  this_local = this;
  std::make_shared<kratos::LatchStmtBlock>();
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::LatchStmtBlock,void>
            (&local_30,(shared_ptr<kratos::LatchStmtBlock> *)this);
  add_stmt(in_RSI,&local_30);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_30);
  sVar1.super___shared_ptr<kratos::LatchStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<kratos::LatchStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::LatchStmtBlock>)
         sVar1.super___shared_ptr<kratos::LatchStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LatchStmtBlock> Generator::latch() {
    auto stmt = std::make_shared<LatchStmtBlock>();
    add_stmt(stmt);
    return stmt;
}